

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::SetPolymorphicInlineCache
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *functionBody,uint index,
          PolymorphicInlineCache *polymorphicInlineCache,bool isInlinee,byte polyCacheUtil)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *pFVar3;
  undefined4 *puVar4;
  ScriptContext *this_00;
  Recycler *recycler;
  PolymorphicInlineCacheInfo *pPVar5;
  byte polyCacheUtil_local;
  bool isInlinee_local;
  PolymorphicInlineCache *polymorphicInlineCache_local;
  uint index_local;
  FunctionBody *functionBody_local;
  EntryPointPolymorphicInlineCacheInfo *this_local;
  
  if (isInlinee) {
    this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    recycler = ScriptContext::GetRecycler(this_00);
    pPVar5 = EnsureInlineeInfo(this,recycler,functionBody);
    SetPolymorphicInlineCache(pPVar5,functionBody,index,polymorphicInlineCache,polyCacheUtil);
    pPVar5 = GetInlineeInfo(this,functionBody);
    pFVar3 = PolymorphicInlineCacheInfo::GetFunctionBody(pPVar5);
    if (functionBody != pFVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1fd4,
                                  "(functionBody == GetInlineeInfo(functionBody)->GetFunctionBody())"
                                  ,"functionBody == GetInlineeInfo(functionBody)->GetFunctionBody()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    SetPolymorphicInlineCache
              (&this->selfInfo,functionBody,index,polymorphicInlineCache,polyCacheUtil);
    pFVar3 = PolymorphicInlineCacheInfo::GetFunctionBody(&this->selfInfo);
    if (functionBody != pFVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1fcf,"(functionBody == selfInfo.GetFunctionBody())",
                                  "functionBody == selfInfo.GetFunctionBody()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void EntryPointPolymorphicInlineCacheInfo::SetPolymorphicInlineCache(FunctionBody * functionBody, uint index, PolymorphicInlineCache * polymorphicInlineCache, bool isInlinee, byte polyCacheUtil)
    {
        if (!isInlinee)
        {
            SetPolymorphicInlineCache(&selfInfo, functionBody, index, polymorphicInlineCache, polyCacheUtil);
            Assert(functionBody == selfInfo.GetFunctionBody());
        }
        else
        {
            SetPolymorphicInlineCache(EnsureInlineeInfo(functionBody->GetScriptContext()->GetRecycler(), functionBody), functionBody, index, polymorphicInlineCache, polyCacheUtil);
            Assert(functionBody == GetInlineeInfo(functionBody)->GetFunctionBody());
        }
    }